

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

string * __thiscall
pbrt::SpectrumConstantTexture::ToString_abi_cxx11_
          (string *__return_storage_ptr__,SpectrumConstantTexture *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<pbrt::SpectrumHandle_const&>
            (__return_storage_ptr__,"[ SpectrumConstantTexture value: %s ]",&this->value);
  return __return_storage_ptr__;
}

Assistant:

std::string SpectrumConstantTexture::ToString() const {
    return StringPrintf("[ SpectrumConstantTexture value: %s ]", value);
}